

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O1

void __thiscall
ProtocolMACEthernet::ProtocolMACEthernet
          (ProtocolMACEthernet *this,ProtocolARP *arp,ProtocolIPv4 *ipv4)

{
  long lVar1;
  
  (this->super_InterfaceMAC)._vptr_InterfaceMAC = (_func_int **)&PTR__ProtocolMACEthernet_00110d10;
  osQueue::osQueue(&this->TxBufferQueue,"Tx",0x14,this->TxBufferBuffer);
  osQueue::osQueue(&this->RxBufferQueue,"Rx",0x14,this->RxBufferBuffer);
  osEvent::osEvent(&this->QueueEmptyEvent,"MACEthernet");
  lVar1 = 0x1a0;
  do {
    DataBuffer::DataBuffer
              ((DataBuffer *)((long)&(this->super_InterfaceMAC)._vptr_InterfaceMAC + lVar1));
    lVar1 = lVar1 + 0x220;
  } while (lVar1 != 0x2c20);
  lVar1 = 0;
  do {
    DataBuffer::DataBuffer((DataBuffer *)(&this->field_0x2c20 + lVar1));
    lVar1 = lVar1 + 0x220;
  } while (lVar1 != 0x2a80);
  this->TxHandler = (DataTransmitHandler)0x0;
  this->ARP = arp;
  this->IPv4 = ipv4;
  this->BroadcastAddress[0] = 0xff;
  this->BroadcastAddress[1] = 0xff;
  this->BroadcastAddress[2] = 0xff;
  this->BroadcastAddress[3] = 0xff;
  this->BroadcastAddress[4] = 0xff;
  this->BroadcastAddress[5] = 0xff;
  lVar1 = 0x1a0;
  do {
    osQueue::Put(&this->TxBufferQueue,
                 (void *)((long)&(this->super_InterfaceMAC)._vptr_InterfaceMAC + lVar1));
    lVar1 = lVar1 + 0x220;
  } while (lVar1 != 0x2c20);
  lVar1 = 0;
  do {
    osQueue::Put(&this->RxBufferQueue,&this->field_0x2c20 + lVar1);
    lVar1 = lVar1 + 0x220;
  } while (lVar1 != 0x2a80);
  return;
}

Assistant:

ProtocolMACEthernet::ProtocolMACEthernet(ProtocolARP& arp, ProtocolIPv4& ipv4)
    : TxBufferQueue("Tx", TX_BUFFER_COUNT, TxBufferBuffer)
    , RxBufferQueue("Rx", RX_BUFFER_COUNT, RxBufferBuffer)
    , QueueEmptyEvent("MACEthernet")
    , TxHandler(nullptr)
    , ARP(arp)
    , IPv4(ipv4)
{
    int i;

    BroadcastAddress[0] = 0xFF;
    BroadcastAddress[1] = 0xFF;
    BroadcastAddress[2] = 0xFF;
    BroadcastAddress[3] = 0xFF;
    BroadcastAddress[4] = 0xFF;
    BroadcastAddress[5] = 0xFF;

    for (i = 0; i < TX_BUFFER_COUNT; i++)
    {
        TxBufferQueue.Put(&TxBuffer[i]);
    }
    for (i = 0; i < RX_BUFFER_COUNT; i++)
    {
        RxBufferQueue.Put(&RxBuffer[i]);
    }
}